

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_handle_lifetime.cpp
# Opt level: O2

ze_result_t __thiscall
validation_layer::ZEHandleLifetimeValidation::zeRTASParallelOperationJoinExtPrologue
          (ZEHandleLifetimeValidation *this,
          ze_rtas_parallel_operation_ext_handle_t hParallelOperation)

{
  bool bVar1;
  ze_result_t zVar2;
  
  bVar1 = HandleLifetimeValidation::isHandleValid<_ze_rtas_parallel_operation_ext_handle_t*>
                    (*(HandleLifetimeValidation **)(context + 0xd48),hParallelOperation);
  zVar2 = ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
  if (bVar1) {
    zVar2 = ZE_RESULT_SUCCESS;
  }
  return zVar2;
}

Assistant:

ze_result_t
    ZEHandleLifetimeValidation::zeRTASParallelOperationJoinExtPrologue(
        ze_rtas_parallel_operation_ext_handle_t hParallelOperation  ///< [in] handle of parallel operation object
        )
    { 
        
        if ( !context.handleLifetime->isHandleValid( hParallelOperation )){
                return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
        }
        return ZE_RESULT_SUCCESS;
    }